

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valcvt-base.h
# Opt level: O1

VCString * __thiscall
mp::pre::VCString::operator+(VCString *__return_storage_ptr__,VCString *this,char (*arg) [6])

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  char *local_40;
  size_type local_38;
  char local_30;
  undefined7 uStack_2f;
  undefined8 uStack_28;
  
  pcVar2 = (this->s_)._M_dataplus._M_p;
  local_40 = &local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar2,pcVar2 + (this->s_)._M_string_length);
  std::__cxx11::string::append((char *)&local_40);
  paVar1 = &(__return_storage_ptr__->s_).field_2;
  (__return_storage_ptr__->s_)._M_dataplus._M_p = (pointer)paVar1;
  if (local_40 == &local_30) {
    paVar1->_M_allocated_capacity = CONCAT71(uStack_2f,local_30);
    *(undefined8 *)((long)&(__return_storage_ptr__->s_).field_2 + 8) = uStack_28;
  }
  else {
    (__return_storage_ptr__->s_)._M_dataplus._M_p = local_40;
    (__return_storage_ptr__->s_).field_2._M_allocated_capacity = CONCAT71(uStack_2f,local_30);
  }
  (__return_storage_ptr__->s_)._M_string_length = local_38;
  __return_storage_ptr__->n_ = 0;
  return __return_storage_ptr__;
}

Assistant:

VCString operator+(const T& arg) const
  { return {s_ + arg}; }